

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileProfilingData.cxx
# Opt level: O2

RAII * __thiscall cmMakefileProfilingData::RAII::operator=(RAII *this,RAII *other)

{
  if (this->Data != (cmMakefileProfilingData *)0x0) {
    StopEntry(this->Data);
  }
  this->Data = other->Data;
  other->Data = (cmMakefileProfilingData *)0x0;
  return this;
}

Assistant:

cmMakefileProfilingData::RAII& cmMakefileProfilingData::RAII::operator=(
  RAII&& other) noexcept
{
  if (this->Data) {
    this->Data->StopEntry();
  }
  this->Data = other.Data;
  other.Data = nullptr;
  return *this;
}